

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

ChainType __thiscall ArgsManager::GetChainType(ArgsManager *this)

{
  ChainType CVar1;
  add_pointer_t<ChainType> ptVar2;
  runtime_error *this_00;
  long in_FS_OFFSET;
  ArgsManager *in_stack_00000008;
  type *parsed;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  arg;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  string local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetChainArg_abi_cxx11_(in_stack_00000008);
  ptVar2 = std::get_if<ChainType,ChainType,std::__cxx11::string>(in_stack_ffffffffffffff68);
  if (ptVar2 == (add_pointer_t<ChainType>)0x0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::get<std::__cxx11::string,ChainType,std::__cxx11::string>(in_stack_ffffffffffffff68);
    tinyformat::format<std::__cxx11::string>
              (in_stack_ffffffffffffff98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,uVar3));
    std::runtime_error::runtime_error(this_00,local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    CVar1 = *ptVar2;
    std::
    variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant(in_stack_ffffffffffffff68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return CVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

ChainType ArgsManager::GetChainType() const
{
    std::variant<ChainType, std::string> arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return *parsed;
    throw std::runtime_error(strprintf("Unknown chain %s.", std::get<std::string>(arg)));
}